

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_fwd_txfm2d.c
# Opt level: O0

void av1_gen_fwd_stage_range
               (int8_t *stage_range_col,int8_t *stage_range_row,TXFM_2D_FLIP_CFG *cfg,int bd)

{
  char *pcVar1;
  int i_1;
  int i;
  int8_t *shift;
  int bd_local;
  TXFM_2D_FLIP_CFG *cfg_local;
  int8_t *stage_range_row_local;
  int8_t *stage_range_col_local;
  
  pcVar1 = cfg->shift;
  for (i = 0; i < cfg->stage_num_col && i < 0xc; i = i + 1) {
    stage_range_col[i] = cfg->stage_range_col[i] + *pcVar1 + (char)bd + '\x01';
  }
  for (i_1 = 0; i_1 < cfg->stage_num_row && i_1 < 0xc; i_1 = i_1 + 1) {
    stage_range_row[i_1] = cfg->stage_range_row[i_1] + *pcVar1 + pcVar1[1] + (char)bd + '\x01';
  }
  return;
}

Assistant:

void av1_gen_fwd_stage_range(int8_t *stage_range_col, int8_t *stage_range_row,
                             const TXFM_2D_FLIP_CFG *cfg, int bd) {
  // Take the shift from the larger dimension in the rectangular case.
  const int8_t *shift = cfg->shift;
  // i < MAX_TXFM_STAGE_NUM will mute above array bounds warning
  for (int i = 0; i < cfg->stage_num_col && i < MAX_TXFM_STAGE_NUM; ++i) {
    stage_range_col[i] = cfg->stage_range_col[i] + shift[0] + bd + 1;
  }

  // i < MAX_TXFM_STAGE_NUM will mute above array bounds warning
  for (int i = 0; i < cfg->stage_num_row && i < MAX_TXFM_STAGE_NUM; ++i) {
    stage_range_row[i] = cfg->stage_range_row[i] + shift[0] + shift[1] + bd + 1;
  }
}